

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O2

string * FormatISO8601Date_abi_cxx11_(string *__return_storage_ptr__,int64_t nTime)

{
  long lVar1;
  uint *in_R9;
  long in_FS_OFFSET;
  year_month_day ymd;
  enable_if_t<__is_duration<duration<long,_ratio<86400L>_>_>::value,_time_point<system_clock,_duration<long,_ratio<86400L,_1L>_>_>_>
  days;
  uint local_30;
  uint local_2c;
  int local_28;
  year_month_day local_24;
  sys_days local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (nTime / 0x15180) * 0x15180;
  local_20.__d.__r = (duration)(nTime / 0x15180 - (ulong)(lVar1 - nTime != 0 && nTime <= lVar1));
  std::chrono::year_month_day::year_month_day(&local_24,&local_20);
  local_28 = (int)local_24._M_y._M_y;
  local_2c = (uint)local_24._M_m._M_m;
  local_30 = (uint)local_24._M_d._M_d;
  tinyformat::format<int,unsigned_int,unsigned_int>
            (__return_storage_ptr__,(tinyformat *)"%04i-%02u-%02u",(char *)&local_28,
             (int *)&local_2c,&local_30,in_R9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string FormatISO8601Date(int64_t nTime)
{
    const std::chrono::sys_seconds secs{std::chrono::seconds{nTime}};
    const auto days{std::chrono::floor<std::chrono::days>(secs)};
    const std::chrono::year_month_day ymd{days};
    return strprintf("%04i-%02u-%02u", signed{ymd.year()}, unsigned{ymd.month()}, unsigned{ymd.day()});
}